

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O0

void __thiscall Scs::Server::Server(Server *this,ServerParams *params)

{
  ServerParams *__t;
  Allocator<char> local_19;
  ServerParams *local_18;
  ServerParams *params_local;
  Server *this_local;
  
  local_18 = params;
  params_local = (ServerParams *)this;
  IServer::IServer(&this->super_IServer);
  (this->super_IServer)._vptr_IServer = (_func_int **)&PTR__Server_0026fa40;
  std::__cxx11::
  list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
  ::list(&this->m_connectionList);
  std::mutex::mutex(&this->m_connectionListMutex);
  std::shared_ptr<Scs::Socket>::shared_ptr(&this->m_listenerSocket);
  std::thread::thread(&this->m_thread);
  std::condition_variable::condition_variable(&this->m_stateCondition);
  std::function<void_(Scs::IServer_&)>::function(&this->m_onStartListening);
  std::function<void_(Scs::IServer_&,_int)>::function(&this->m_onConnect);
  std::function<void_(Scs::IServer_&,_int)>::function(&this->m_onDisconnect);
  std::function<void_(Scs::IServer_&,_int,_const_void_*,_unsigned_long)>::function
            (&this->m_onReceiveData);
  std::function<void_(Scs::IServer_&)>::function(&this->m_onUpdate);
  std::mutex::mutex(&this->m_notifierMutex);
  __t = local_18;
  Allocator<char>::Allocator(&local_19);
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  basic_string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_port,
             &__t->port,&local_19);
  Allocator<char>::~Allocator(&local_19);
  this->m_maxConnections = local_18->maxConnections;
  this->m_timeoutMs = (long)(local_18->timeoutSeconds * 1000.0);
  this->m_maxClientId = 0;
  std::atomic<Scs::Server::Status>::atomic(&this->m_status,Initial);
  std::atomic<bool>::atomic(&this->m_shutDown,false);
  std::atomic<bool>::atomic(&this->m_error,false);
  return;
}

Assistant:

Server::Server(const ServerParams & params) :
	m_port(params.port),
	m_maxConnections(params.maxConnections),
	m_timeoutMs(static_cast<long long>(params.timeoutSeconds * 1000.0))
{
}